

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::advance(QGraphicsScene *this)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  bool bVar4;
  QList<QGraphicsItem_*> *__range2;
  bool bVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
              (&local_58,*(long **)(*(long *)(this + 8) + 0x88),1);
    if (local_48 != (undefined1 *)0x0) {
      lVar3 = CONCAT44(uStack_4c,uStack_50);
      lVar6 = (long)local_48 << 3;
      lVar7 = 0;
      do {
        plVar1 = *(long **)(lVar3 + lVar7);
        (**(code **)(*plVar1 + 0x10))(plVar1,uVar8);
        lVar7 = lVar7 + 8;
      } while (lVar6 != lVar7);
    }
    piVar2 = (int *)CONCAT44(uStack_54,local_58);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),8,0x10);
      }
    }
    uVar8 = 1;
    bVar4 = false;
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::advance()
{
    for (int i = 0; i < 2; ++i) {
        const auto items_ = items();
        for (QGraphicsItem *item : items_)
            item->advance(i);
    }
}